

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall glslang::HlslParseContext::~HlslParseContext(HlslParseContext *this)

{
  HlslParseContext *this_local;
  
  (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions =
       (_func_int **)&PTR__HlslParseContext_013aa5b0;
  TMap<long_long,_glslang::HlslParseContext::tShadowTextureSymbols_*,_std::less<long_long>_>::~TMap
            (&this->textureShadowVariant);
  TVector<glslang::HlslParseContext::tGsAppendData>::~TVector(&this->gsAppends);
  TVector<glslang::HlslParseContext::tMipsOperatorData>::~TVector(&this->mipsOperatorMipArg);
  TVector<glslang::TVariable_*>::~TVector(&this->implicitThisStack);
  TVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
  ::~TVector(&this->currentTypePrefix);
  TMap<glslang::TBuiltInVariable,_glslang::TSymbol_*,_std::less<glslang::TBuiltInVariable>_>::~TMap
            (&this->builtInTessLinkageSymbols);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&this->patchConstantFunctionName);
  TMap<glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*,_std::less<glslang::HlslParseContext::tInterstageIoData>_>
  ::~TMap(&this->splitBuiltIns);
  TMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ::~TMap(&this->structBufferCounter);
  TVector<glslang::TVector<glslang::TTypeLoc>_*>::~TVector(&this->textureReturnStruct);
  TVector<glslang::TType_*>::~TVector(&this->structBufferTypes);
  TMap<long_long,_glslang::TVariable_*,_std::less<long_long>_>::~TMap(&this->splitNonIoVars);
  TMap<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>_>
  ::~TMap(&this->ioTypeMap);
  TMap<long_long,_glslang::HlslParseContext::TFlattenData,_std::less<long_long>_>::~TMap
            (&this->flattenMap);
  TVector<glslang::TSymbol_*>::~TVector(&this->ioArraySymbolResizeList);
  TVector<glslang::TIntermTyped_*>::~TVector(&this->needsIndexLimitationChecking);
  std::set<long_long,_std::less<long_long>,_std::allocator<long_long>_>::~set
            (&this->inductiveLoopIds);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&this->currentCaller);
  TParseContextBase::~TParseContextBase(&this->super_TParseContextBase);
  return;
}

Assistant:

HlslParseContext::~HlslParseContext()
{
}